

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O3

void UnitTests::
     OutputRange<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (ostream *os,_List_iterator<long> first1,_List_iterator<long> last1,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first2,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last2,
               _List_iterator<long> point_out)

{
  ostream *poVar1;
  _List_iterator<long> _Var2;
  char *pcVar3;
  
  if (first2._M_current != last2._M_current || first1._M_node != last1._M_node) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"\telement[",9);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] = (",5);
      _Var2 = OutputElement<std::_List_iterator<long>>(os,first1,last1);
      std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
      first2 = OutputElement<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (os,first2,last2);
      pcVar3 = ")\n";
      if (first1._M_node == point_out._M_node) {
        pcVar3 = ") <--------- HERE\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (os,pcVar3,(ulong)(first1._M_node == point_out._M_node) << 4 | 2);
      first1 = _Var2;
    } while ((_Var2._M_node != last1._M_node) || (first2._M_current != last2._M_current));
  }
  return;
}

Assistant:

void OutputRange(std::ostream& os, It1 first1, It1 last1, It2 first2, It2 last2, It1 point_out)
    {
        auto n = 0U;
        while (first1 != last1 || first2 != last2)
        {
            os << "\telement[" << n++ << "] = (";
            auto point_out_this_line = first1 == point_out;

            first1 = OutputElement(os, first1, last1);
            os << ",";
            first2 = OutputElement(os, first2, last2);
            os << (point_out_this_line ? ") <--------- HERE\n" : ")\n");
        }
    }